

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.h
# Opt level: O0

void __thiscall PurchasedServer::PurchasedServer(PurchasedServer *this)

{
  undefined2 *in_RDI;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 3) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  memset(in_RDI + 8,0,0x38);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x132d02);
  return;
}

Assistant:

PurchasedServer() = default;